

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateExtensionRegistrationCode
          (ImmutableMessageGenerator *this,Printer *printer)

{
  int iVar1;
  ImmutableMessageGenerator *in_RSI;
  long in_RDI;
  int i_1;
  int i;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  Printer *in_stack_ffffffffffffff78;
  ImmutableExtensionGenerator *in_stack_ffffffffffffff80;
  undefined4 local_60;
  Context *in_stack_ffffffffffffffc0;
  Descriptor *in_stack_ffffffffffffffc8;
  Context *in_stack_ffffffffffffffd0;
  FieldDescriptor *in_stack_ffffffffffffffd8;
  ImmutableExtensionGenerator *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar2;
  int index;
  
  iVar2 = 0;
  while( true ) {
    index = iVar2;
    iVar1 = Descriptor::extension_count(*(Descriptor **)(in_RDI + 8));
    if (iVar1 <= iVar2) break;
    Descriptor::extension(*(Descriptor **)(in_RDI + 8),index);
    ImmutableExtensionGenerator::ImmutableExtensionGenerator
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    ImmutableExtensionGenerator::GenerateRegistrationCode
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    ImmutableExtensionGenerator::~ImmutableExtensionGenerator
              ((ImmutableExtensionGenerator *)
               CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    iVar2 = index + 1;
  }
  local_60 = 0;
  while( true ) {
    iVar2 = local_60;
    iVar1 = Descriptor::nested_type_count(*(Descriptor **)(in_RDI + 8));
    if (iVar1 <= iVar2) break;
    Descriptor::nested_type(*(Descriptor **)(in_RDI + 8),local_60);
    ImmutableMessageGenerator
              ((ImmutableMessageGenerator *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
               in_stack_ffffffffffffffc0);
    GenerateExtensionRegistrationCode(in_RSI,(Printer *)CONCAT44(index,in_stack_ffffffffffffffe8));
    ~ImmutableMessageGenerator
              ((ImmutableMessageGenerator *)CONCAT44(iVar2,in_stack_ffffffffffffff40));
    local_60 = local_60 + 1;
  }
  return;
}

Assistant:

void ImmutableMessageGenerator::GenerateExtensionRegistrationCode(
    io::Printer* printer) {
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionGenerator(descriptor_->extension(i), context_)
        .GenerateRegistrationCode(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    ImmutableMessageGenerator(descriptor_->nested_type(i), context_)
        .GenerateExtensionRegistrationCode(printer);
  }
}